

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.hpp
# Opt level: O0

Tensor<3> * __thiscall
Omega_h::average_metric<3,4>
          (Tensor<3> *__return_storage_ptr__,Omega_h *this,Few<Omega_h::Matrix<3,_3>,_4> ms,
          bool has_degen)

{
  Tensor<3> m;
  Tensor<3> am_00;
  long lVar1;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  double local_c0;
  int local_b8;
  Int local_b4;
  Int i_1;
  Int ngood;
  Matrix<3,_3> am;
  undefined8 uStack_60;
  bool has_degen_local;
  Vector<3> v;
  Int j;
  int local_34;
  Int i;
  
  am.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2]._7_1_ =
       (byte)this & 1;
  for (v.super_Few<double,_3>.array_[2]._0_4_ = 0; v.super_Few<double,_3>.array_[2]._0_4_ < 3;
      v.super_Few<double,_3>.array_[2]._0_4_ = v.super_Few<double,_3>.array_[2]._0_4_ + 1) {
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      *(undefined8 *)((long)&stack0xffffffffffffffa0 + (long)local_34 * 8) = 0;
    }
    v.super_Few<double,_3>.array_[2]._4_4_ = v.super_Few<double,_3>.array_[2]._0_4_;
    lVar1 = (long)v.super_Few<double,_3>.array_[2]._0_4_;
    *(undefined8 *)(&i_1 + lVar1 * 6) = uStack_60;
    am.super_Few<Omega_h::Vector<3>,_3>.array_[lVar1].super_Few<double,_3>.array_[0] =
         v.super_Few<double,_3>.array_[0];
    am.super_Few<Omega_h::Vector<3>,_3>.array_[lVar1].super_Few<double,_3>.array_[1] =
         v.super_Few<double,_3>.array_[1];
  }
  local_b4 = 0;
  for (local_b8 = 0; local_b8 < 4; local_b8 = local_b8 + 1) {
    memcpy(&local_100,ms.array_ + local_b8,0x48);
    m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] = (double)uStack_f8;
    m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] = (double)local_100;
    m.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] = (double)local_f0;
    m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] = (double)uStack_e8;
    m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] = (double)local_e0;
    m.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] = (double)uStack_d8;
    m.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0] = (double)local_d0;
    m.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] = (double)uStack_c8;
    m.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2] = local_c0;
    average_metric_contrib<3>
              ((Tensor<3> *)&i_1,&local_b4,m,
               (bool)(am.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2].
                      _7_1_ & 1));
  }
  memcpy(&local_148,&i_1,0x48);
  am_00.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
       (double)uStack_140;
  am_00.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
       (double)local_148;
  am_00.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
       (double)local_138;
  am_00.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] =
       (double)uStack_130;
  am_00.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] =
       (double)local_128;
  am_00.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] =
       (double)uStack_120;
  am_00.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0] =
       (double)local_118;
  am_00.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] =
       (double)uStack_110;
  am_00.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2] = local_108;
  average_metric_finish<3>
            (__return_storage_ptr__,am_00,local_b4,
             (bool)(am.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2].
                    _7_1_ & 1));
  return __return_storage_ptr__;
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> average_metric(
    Few<Tensor<dim>, n> const ms, bool const has_degen) {
  auto am = zero_matrix<dim, dim>();
  Int ngood = 0;
  for (Int i = 0; i < n; ++i) {
    average_metric_contrib(am, ngood, ms[i], has_degen);
  }
  return average_metric_finish(am, ngood, has_degen);
}